

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

void __thiscall
iqxmlrpc::Server::schedule_response
          (Server *this,Response *resp,Server_connection *conn,Executor *exec)

{
  Packet *this_00;
  Response_header *this_01;
  Response *response;
  allocator<char> local_89;
  string local_88;
  Packet *local_68;
  Packet *packet;
  undefined1 local_50 [8];
  string resp_str;
  auto_ptr<iqxmlrpc::Executor> executor_to_delete;
  Executor *exec_local;
  Server_connection *conn_local;
  Response *resp_local;
  Server *this_local;
  
  std::auto_ptr<iqxmlrpc::Executor>::auto_ptr
            ((auto_ptr<iqxmlrpc::Executor> *)((long)&resp_str.field_2 + 8),exec);
  dump_response_abi_cxx11_((string *)local_50,(iqxmlrpc *)resp,response);
  this_00 = (Packet *)operator_new(0x38);
  this_01 = (Response_header *)operator_new(0xb0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"OK",&local_89);
  http::Response_header::Response_header(this_01,200,&local_88);
  http::Packet::Packet(this_00,(Header *)this_01,(string *)local_50);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  local_68 = this_00;
  Server_connection::schedule_response(conn,this_00);
  std::__cxx11::string::~string((string *)local_50);
  std::auto_ptr<iqxmlrpc::Executor>::~auto_ptr
            ((auto_ptr<iqxmlrpc::Executor> *)((long)&resp_str.field_2 + 8));
  return;
}

Assistant:

void Server::schedule_response(
  const Response& resp, Server_connection* conn, Executor* exec )
{
  std::auto_ptr<Executor> executor_to_delete(exec);
  std::string resp_str = dump_response(resp);
  http::Packet *packet = new http::Packet(new http::Response_header(), resp_str);
  conn->schedule_response( packet );
}